

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  
  std::operator<<((ostream *)&std::cout,"\x1b[34m");
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "------------- Running tests for Dice class -------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"Dice");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"constructor");
  poVar2 = std::operator<<(poVar2,"() method: ");
  poVar2 = std::operator<<(poVar2,"\x1b[32mPass");
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"Dice");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"roll");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Dice_roll();
  pcVar4 = "\x1b[31mFail";
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\x1b[34m");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "---------- Running tests for DiceRoller class ----------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"DiceRoller");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"constructor");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_DiceRoller();
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"DiceRoller");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"roll");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_DiceRoller_roll();
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"DiceRoller");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"getHistory");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_DiceRoller_getHistory();
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"DiceRoller");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"getDiceRoller");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_DiceRoller_getDiceRolled();
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar2 = std::operator<<(poVar2,"DiceRoller");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"getPercentages");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_DiceRoller_getPercentages();
  if (bVar1) {
    pcVar4 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main() {
    std::cout << "\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------- Running tests for Dice class -------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    std::cout << assert("Dice", "constructor", test_Dice());
    std::cout << assert("Dice", "roll", test_Dice_roll());

    std::cout << "\033[34m" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "---------- Running tests for DiceRoller class ----------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    std::cout << assert("DiceRoller", "constructor", test_DiceRoller());
    std::cout << assert("DiceRoller", "roll", test_DiceRoller_roll());
    std::cout << assert("DiceRoller", "getHistory", test_DiceRoller_getHistory());
    std::cout << assert("DiceRoller", "getDiceRoller", test_DiceRoller_getDiceRolled());
    std::cout << assert("DiceRoller", "getPercentages", test_DiceRoller_getPercentages());

    return 0;
}